

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_Poll(PortMidiStream *stream)

{
  int iVar1;
  PmError local_24;
  PmError err;
  PmInternal *midi;
  PortMidiStream *stream_local;
  
  pm_hosterror = 0;
  if (stream == (PortMidiStream *)0x0) {
    local_24 = pmBadPtr;
  }
  else if (descriptors[*stream].pub.opened == 0) {
    local_24 = pmBadPtr;
  }
  else if (descriptors[*stream].pub.input == 0) {
    local_24 = pmBadPtr;
  }
  else {
    local_24 = (**(code **)(*(long *)((long)stream + 0x50) + 0x50))(stream);
  }
  if (local_24 == pmNoData) {
    iVar1 = Pm_QueueEmpty(*(PmQueue **)((long)stream + 0x20));
    stream_local._4_4_ = (PmError)((iVar1 != 0 ^ 0xffU) & 1);
  }
  else {
    if (local_24 == pmHostError) {
      (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
      pm_hosterror = 1;
    }
    stream_local._4_4_ = local_24;
  }
  return stream_local._4_4_;
}

Assistant:

PMEXPORT PmError Pm_Poll( PortMidiStream *stream )
{
    PmInternal *midi = (PmInternal *) stream;
    PmError err;

    pm_hosterror = FALSE;
    /* arg checking */
    if(midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.input)
        err = pmBadPtr;
    else
        err = (*(midi->dictionary->poll))(midi);

    if (err != pmNoError) {
        if (err == pmHostError) {
            midi->dictionary->host_error(midi, pm_hosterror_text, 
                                         PM_HOST_ERROR_MSG_LEN);
           pm_hosterror = TRUE;
        }
        return pm_errmsg(err);
    }

    return (PmError) !Pm_QueueEmpty(midi->queue);
}